

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestsessionFixtureSessionDoesNotRefreshOnLogon::RunImpl
          (TestsessionFixtureSessionDoesNotRefreshOnLogon *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_648 [8];
  sessionFixtureSessionDoesNotRefreshOnLogonHelper fixtureHelper;
  bool ctorOk;
  TestsessionFixtureSessionDoesNotRefreshOnLogon *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  sessionFixtureSessionDoesNotRefreshOnLogonHelper::sessionFixtureSessionDoesNotRefreshOnLogonHelper
            ((sessionFixtureSessionDoesNotRefreshOnLogonHelper *)local_648,
             &(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  UnitTest::ExecuteTest<SuiteSessionTests::sessionFixtureSessionDoesNotRefreshOnLogonHelper>
            ((sessionFixtureSessionDoesNotRefreshOnLogonHelper *)local_648,
             &(this->super_Test).m_details);
  sessionFixtureSessionDoesNotRefreshOnLogonHelper::
  ~sessionFixtureSessionDoesNotRefreshOnLogonHelper
            ((sessionFixtureSessionDoesNotRefreshOnLogonHelper *)local_648);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, SessionDoesNotRefreshOnLogon) {
  createSession(1);
  object->setRefreshOnLogon(false);
  CHECK(!object->getRefreshOnLogon());
}